

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_writer.hpp
# Opt level: O0

void __thiscall
BinaryWriter::emplace_chars<char(*)(char)>
          (BinaryWriter *this,size_t count,char *data,_func_char_char *transform)

{
  uchar uVar1;
  type puVar2;
  ulong local_30;
  size_t i;
  _func_char_char *transform_local;
  char *data_local;
  size_t count_local;
  BinaryWriter *this_local;
  
  if (this->offset + count <= this->max_offset) {
    transform_local = (_func_char_char *)data;
    for (local_30 = 0; local_30 < count; local_30 = local_30 + 1) {
      if (*transform_local == (_func_char_char)0x0) {
        puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           (&this->bytecode,this->offset + local_30);
        *puVar2 = '\0';
      }
      else {
        uVar1 = (*transform)((char)*transform_local);
        puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                           (&this->bytecode,this->offset + local_30);
        *puVar2 = uVar1;
        transform_local = transform_local + 1;
      }
    }
    this->offset = count + this->offset;
    return;
  }
  __assert_fail("this->offset + count <= max_offset",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/binary_writer.hpp"
                ,0x67,
                "void BinaryWriter::emplace_chars(size_t, const char *, FuncT) [FuncT = char (*)(char)]"
               );
}

Assistant:

void emplace_chars(size_t count, const char* data, FuncT transform)
    {
        assert(this->offset + count <= max_offset);
        for(size_t i = 0; i < count; ++i)
        {
            if(*data == 0)
                this->bytecode[offset+i] = 0;
            else
                this->bytecode[offset+i] = transform(*data++);
        }
        this->offset += count;
    }